

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::FinishReturnCall(CWriter *this)

{
  Func *pFVar1;
  pointer args;
  Newline *extraout_RDX;
  Newline *extraout_RDX_00;
  Newline *u;
  vector<wabt::Type,_std::allocator<wabt::Type>_> *u_00;
  Newline *u_01;
  LabelName *extraout_RDX_01;
  LabelName *extraout_RDX_02;
  LabelName *u_02;
  CloseBrace *t;
  Newline *in_R8;
  char (*in_R9) [52];
  Newline *in_stack_ffffffffffffffb8;
  string *local_40;
  long *local_38 [2];
  long local_28 [2];
  
  if (this->in_tail_callee_ == true) {
    Write(this);
    u = extraout_RDX;
    if (this->consecutive_newline_count_ < 2) {
      WriteData(this,"\n",1);
      this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
      u = extraout_RDX_00;
    }
    this->should_write_indent_next_ = true;
    (anonymous_namespace)::CWriter::Write<char_const(&)[8],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [8])"return;",u);
    return;
  }
  WriteData(this,"while (next->fn) { next->fn(instance_ptr, tail_call_stack, next); }",0x43);
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
  }
  this->should_write_indent_next_ = true;
  args = (this->func_->decl).sig.result_types.
         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data
         ._M_finish;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<wabt::Type_const*,std::vector<wabt::Type,std::allocator<wabt::Type>>>>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&this->type_stack_,
             (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
             .super__Vector_impl_data._M_finish,
             (this->func_->decl).sig.result_types.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start);
  pFVar1 = this->func_;
  if ((pFVar1->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pFVar1->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::OpenBrace,std::vector<wabt::Type,std::allocator<wabt::Type>>const&,char_const(&)[6],wabt::(anonymous_namespace)::Newline,char_const(&)[52],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(OpenBrace *)&(pFVar1->decl).sig.result_types,u_00,(char (*) [6])args
               ,in_R8,in_R9,in_stack_ffffffffffffffb8);
    t = (CloseBrace *)&(this->func_->decl).sig.result_types;
    Unspill(this,(TypeVector *)t);
    (anonymous_namespace)::CWriter::
    Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,t,u_01);
  }
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,&(anonymous_namespace)::kImplicitFuncLabel,0x1f051a);
  local_40 = (string *)local_38;
  Write(this);
  u_02 = extraout_RDX_01;
  if (this->consecutive_newline_count_ < 2) {
    WriteData(this,"\n",1);
    this->consecutive_newline_count_ = this->consecutive_newline_count_ + 1;
    u_02 = extraout_RDX_02;
  }
  this->should_write_indent_next_ = true;
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[6],wabt::(anonymous_namespace)::LabelName,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [6])&local_40,u_02,(char (*) [2])args,in_R8);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

void CWriter::FinishReturnCall() {
  if (in_tail_callee_) {
    Write(CloseBrace(), Newline(), "return;", Newline());
    return;
  }

  Write("while (next->fn) { next->fn(instance_ptr, tail_call_stack, next); }",
        Newline());
  PushTypes(func_->decl.sig.result_types);
  if (!func_->decl.sig.result_types.empty()) {
    Write(OpenBrace(), func_->decl.sig.result_types, " tmp;", Newline(),
          "wasm_rt_memcpy(&tmp, tail_call_stack, sizeof(tmp));", Newline());
    Unspill(func_->decl.sig.result_types);
    Write(CloseBrace(), Newline());
  }

  Write(CloseBrace(), Newline(), "goto ", LabelName(kImplicitFuncLabel), ";",
        Newline());
}